

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::ConvertFromFloat(void *dst,float *src,DataType dt,int numChannels)

{
  uint16_t uVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  
  switch(dt) {
  case dt_uint8:
    uVar2 = 0;
    uVar3 = (ulong)(uint)numChannels;
    if (numChannels < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      fVar4 = src[uVar2];
      if (fVar4 <= 0.0) {
        fVar4 = 0.0;
      }
      if (1.0 <= fVar4) {
        fVar4 = 1.0;
      }
      *(char *)((long)dst + uVar2) = (char)(int)(fVar4 * 255.0 + 0.5);
    }
    break;
  case dt_uint16:
    uVar2 = 0;
    uVar3 = (ulong)(uint)numChannels;
    if (numChannels < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      fVar4 = src[uVar2];
      if (fVar4 <= 0.0) {
        fVar4 = 0.0;
      }
      if (1.0 <= fVar4) {
        fVar4 = 1.0;
      }
      *(short *)((long)dst + uVar2 * 2) = (short)(int)(fVar4 * 65535.0 + 0.5);
    }
    break;
  case dt_half:
    uVar2 = 0;
    uVar3 = (ulong)(uint)numChannels;
    if (numChannels < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = PtexHalf::fromFloat(src[uVar2] + 0.0);
      *(uint16_t *)((long)dst + uVar2 * 2) = uVar1;
    }
    break;
  case dt_float:
    memcpy(dst,src,(long)numChannels << 2);
    return;
  }
  return;
}

Assistant:

void ConvertFromFloat(void* dst, const float* src, DataType dt, int numChannels)
{
    switch (dt) {
    case dt_uint8:  ConvertArrayClamped(static_cast<uint8_t*>(dst),  src, numChannels, 255.0, 0.5); break;
    case dt_uint16: ConvertArrayClamped(static_cast<uint16_t*>(dst), src, numChannels, 65535.0, 0.5); break;
    case dt_half:   ConvertArray(static_cast<PtexHalf*>(dst), src, numChannels, 1.0); break;
    case dt_float:  memcpy(dst, src, sizeof(float)*numChannels); break;
    }
}